

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O0

void pzshape::TPZShapeTetra::SideShape
               (int side,TPZVec<double> *point,TPZVec<long> *id,TPZVec<int> *order,
               TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  int64_t in_RCX;
  int64_t in_RDX;
  TPZFMatrix<double> *in_RSI;
  int in_EDI;
  TPZFMatrix<double> *in_stack_00000a60;
  TPZFMatrix<double> *in_stack_00000a68;
  TPZVec<int> *in_stack_00000a70;
  TPZVec<long> *in_stack_00000a78;
  TPZVec<double> *in_stack_00000a80;
  TPZFMatrix<double> *in_stack_00001390;
  TPZFMatrix<double> *in_stack_00001398;
  TPZVec<int> *in_stack_000013a0;
  TPZVec<long> *in_stack_000013a8;
  TPZVec<double> *in_stack_000013b0;
  TPZFMatrix<double> *in_stack_00001890;
  TPZFMatrix<double> *in_stack_00001898;
  TPZVec<int> *in_stack_000018a0;
  TPZVec<long> *in_stack_000018a8;
  TPZVec<double> *in_stack_000018b0;
  
  if ((in_EDI < 0) || (0xf < in_EDI)) {
    std::operator<<((ostream *)&std::cerr,"TPZCompElT3d::SideShapeFunction. Bad paramenter side.\n")
    ;
  }
  else if (in_EDI == 0xe) {
    Shape(in_stack_000018b0,in_stack_000018a8,in_stack_000018a0,in_stack_00001898,in_stack_00001890)
    ;
  }
  else if (in_EDI < 4) {
    pdVar1 = TPZFMatrix<double>::operator()(in_RSI,in_RDX,in_RCX);
    *pdVar1 = 1.0;
  }
  else if (in_EDI < 10) {
    TPZShapeLinear::Shape
              (in_stack_00000a80,in_stack_00000a78,in_stack_00000a70,in_stack_00000a68,
               in_stack_00000a60);
  }
  else if (in_EDI < 0xe) {
    TPZShapeTriang::Shape
              (in_stack_000013b0,in_stack_000013a8,in_stack_000013a0,in_stack_00001398,
               in_stack_00001390);
  }
  return;
}

Assistant:

void TPZShapeTetra::SideShape(int side, TPZVec<REAL> &point, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		if(side<0 || side>15) PZError << "TPZCompElT3d::SideShapeFunction. Bad paramenter side.\n";
		else if(side==14) Shape(point,id,order,phi,dphi);
		else if(side<4) phi(0,0)=1.;
		else if(side<10) {//4 a 9
			TPZShapeLinear::Shape(point,id,order,phi,dphi);
		}
		else if(side<14) {//faces 10,11,12,13
			TPZShapeTriang::Shape(point,id,order,phi,dphi);
		}
		
	}